

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::ValidateReadBuffer(SACSubcaseBase *this,Vec4 *expected)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int x_00;
  int y_00;
  bool bVar4;
  int iVar5;
  int width;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  float *pfVar7;
  TestContext *this_00;
  TestLog *log_00;
  bool isOk;
  TestLog *log;
  int local_98;
  int local_94;
  int x;
  int y;
  undefined1 local_58 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  Vec4 *expected_local;
  SACSubcaseBase *this_local;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_SubcaseBase).super_GLWrapper.m_context);
  iVar5 = (*pRVar6->_vptr_RenderContext[4])();
  width = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar5));
  iVar5 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var,iVar5));
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,width,iVar5);
  tcu::Surface::Surface((Surface *)local_58,width,iVar5);
  pRVar6 = deqp::Context::getRenderContext((this->super_SubcaseBase).super_GLWrapper.m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&x,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(pRVar6,0,0,(PixelBufferAccess *)&x);
  for (local_94 = 0; local_94 < iVar5; local_94 = local_94 + 1) {
    for (local_98 = 0; y_00 = local_94, x_00 = local_98, local_98 < width; local_98 = local_98 + 1)
    {
      pfVar7 = tcu::Vector<float,_4>::operator[](expected,0);
      fVar1 = *pfVar7;
      pfVar7 = tcu::Vector<float,_4>::operator[](expected,1);
      fVar2 = *pfVar7;
      pfVar7 = tcu::Vector<float,_4>::operator[](expected,2);
      fVar3 = *pfVar7;
      pfVar7 = tcu::Vector<float,_4>::operator[](expected,3);
      tcu::RGBA::RGBA((RGBA *)((long)&log + 4),(int)(fVar1 * 255.0),(int)(fVar2 * 255.0),
                      (int)(fVar3 * 255.0),(int)(*pfVar7 * 255.0));
      tcu::Surface::setPixel((Surface *)local_58,x_00,y_00,log._4_4_);
    }
  }
  this_00 = deqp::Context::getTestContext((this->super_SubcaseBase).super_GLWrapper.m_context);
  log_00 = tcu::TestContext::getLog(this_00);
  bVar4 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",(Surface *)local_58,
                            (Surface *)&referenceFrame.m_pixels.m_cap,0.05,COMPARE_LOG_RESULT);
  iVar5 = -1;
  if (bVar4) {
    iVar5 = 0;
  }
  tcu::Surface::~Surface((Surface *)local_58);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  return (long)iVar5;
}

Assistant:

long ValidateReadBuffer(const Vec4& expected)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		int						 viewportW	= renderTarget.getWidth();
		int						 viewportH	= renderTarget.getHeight();
		tcu::Surface			 renderedFrame(viewportW, viewportH);
		tcu::Surface			 referenceFrame(viewportW, viewportH);

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		for (int y = 0; y < viewportH; ++y)
		{
			for (int x = 0; x < viewportW; ++x)
			{
				referenceFrame.setPixel(
					x, y, tcu::RGBA(static_cast<int>(expected[0] * 255), static_cast<int>(expected[1] * 255),
									static_cast<int>(expected[2] * 255), static_cast<int>(expected[3] * 255)));
			}
		}
		tcu::TestLog& log = m_context.getTestContext().getLog();
		bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f,
									  tcu::COMPARE_LOG_RESULT);
		return (isOk ? NO_ERROR : ERROR);
	}